

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGLApplication.cpp
# Opt level: O3

void __thiscall fw::OpenGLApplication::destroy(OpenGLApplication *this)

{
  Writer *pWVar1;
  Writer local_78;
  
  (*this->_vptr_OpenGLApplication[3])();
  glfwTerminate();
  local_78._vptr_Writer = (_func_int **)&PTR__Writer_001f54f0;
  local_78.m_level = Info;
  local_78.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/framework/OpenGLApplication.cpp"
  ;
  local_78.m_line = 0x67;
  local_78.m_func = "void fw::OpenGLApplication::destroy()";
  local_78.m_verboseLevel = 0;
  local_78.m_logger = (Logger *)0x0;
  local_78.m_proceed = false;
  local_78.m_messageBuilder.m_logger = (Logger *)0x0;
  local_78.m_messageBuilder.m_containerLogSeperator = "";
  local_78.m_dispatchAction = NormalLog;
  local_78.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar1 = el::base::Writer::construct(&local_78,1,"framework");
  if (pWVar1->m_proceed == true) {
    el::base::MessageBuilder::operator<<
              (&pWVar1->m_messageBuilder,"Window destroyed and GLFW3 terminated.");
  }
  el::base::Writer::~Writer(&local_78);
  return;
}

Assistant:

void OpenGLApplication::destroy()
{
    onDestroy();
    glfwTerminate();
    LOG(INFO) << "Window destroyed and GLFW3 terminated.";
}